

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

bool __thiscall Env::insertvar(Env *this,string *s,attr *a)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  int *in_RDX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
  *unaff_retaddr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Self local_28;
  int *local_20;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_20 = in_RDX;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x10cca7);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar3 = std::operator!=(&local_28,&local_30);
  piVar2 = local_20;
  if (bVar3) {
    bVar3 = false;
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
             ::operator[](unaff_retaddr,
                          (key_type *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8))
    ;
    iVar1 = piVar2[1];
    pmVar4->kind = piVar2[0];
    *(int *)&pmVar4->field_0x4 = iVar1;
    pmVar4->field_1 = *(anon_union_8_4_35def4f3_for_attr_1 *)(piVar2 + 2);
    if (*local_20 == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar5 = strdup(pcVar5);
      **(undefined8 **)(local_20 + 2) = pcVar5;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Env::insertvar(const string &s, const struct attr &a) {
    if (var_table.find(s) != var_table.end())
        return false;
    var_table[s] = a;
    if (a.kind == BASIC) {
        a.basic->name = strdup(s.c_str());
    }
    return true;
}